

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.hh
# Opt level: O0

void __thiscall
QPDFTokenizer::Token::Token
          (Token *this,token_type_e type,string *value,string *raw_value,string *error_message)

{
  string *error_message_local;
  string *raw_value_local;
  string *value_local;
  token_type_e type_local;
  Token *this_local;
  
  this->type = type;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  std::__cxx11::string::string((string *)&this->raw_value,(string *)raw_value);
  std::__cxx11::string::string((string *)&this->error_message,(string *)error_message);
  return;
}

Assistant:

Token(
            token_type_e type,
            std::string const& value,
            std::string raw_value,
            std::string error_message) :
            type(type),
            value(value),
            raw_value(raw_value),
            error_message(error_message)
        {
        }